

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

optional_idx
duckdb::GetFunctionDescriptionIndex
          (vector<duckdb::FunctionDescription,_true> *function_descriptions,
          vector<duckdb::LogicalType,_true> *function_parameter_types)

{
  pointer pLVar1;
  pointer pLVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference rhs;
  const_reference rhs_00;
  idx_t iVar6;
  ulong uVar7;
  size_type __n;
  ulong __n_00;
  idx_t iVar8;
  size_type __n_01;
  optional_idx specificity_score;
  optional_idx best_specificity_score;
  idx_t local_70;
  optional_idx local_58;
  optional_idx local_50;
  LogicalType local_48;
  
  if ((long)(function_descriptions->
            super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>)
            .
            super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(function_descriptions->
            super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>)
            .
            super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    pLVar1 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar2 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70 = 0;
    pvVar4 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
    if ((pvVar4->parameter_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar4->parameter_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar7 = ((long)pLVar1 - (long)pLVar2 >> 3) * -0x5555555555555555;
      local_70 = 0;
      __n_00 = 0;
      do {
        if (__n_00 < uVar7) {
          pvVar4 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
          pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&pvVar4->parameter_types,__n_00);
          LogicalType::LogicalType(&local_48,ANY);
          bVar3 = LogicalType::operator==(pvVar5,&local_48);
          if (bVar3) goto LAB_00a4bae8;
          pvVar4 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
          pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&pvVar4->parameter_types,__n_00);
          rhs = vector<duckdb::LogicalType,_true>::operator[](function_parameter_types,__n_00);
          bVar3 = LogicalType::operator==(pvVar5,rhs);
          bVar3 = !bVar3;
        }
        else {
LAB_00a4bae8:
          bVar3 = false;
        }
        if (__n_00 < uVar7) {
          LogicalType::~LogicalType(&local_48);
        }
        if (bVar3) {
          return (optional_idx)0xffffffffffffffff;
        }
        __n_00 = __n_00 + 1;
        pvVar4 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
      } while (__n_00 < (ulong)(((long)(pvVar4->parameter_types).
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar4->parameter_types).
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  else {
    local_50.index = 0xffffffffffffffff;
    local_70 = 0xffffffffffffffff;
    local_58.index = 0xffffffffffffffff;
    if ((function_descriptions->
        super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
        super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (function_descriptions->
        super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
        super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_70 = 0xffffffffffffffff;
      __n = 0;
      do {
        pvVar4 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,__n);
        pLVar1 = (pvVar4->parameter_types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar2 = (pvVar4->parameter_types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((long)pLVar2 - (long)pLVar1 ==
            (long)(function_parameter_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(function_parameter_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          if (pLVar2 == pLVar1) {
            iVar8 = 0;
          }
          else {
            __n_01 = 0;
            iVar8 = 0;
            do {
              pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                                 (&pvVar4->parameter_types,__n_01);
              if (pvVar5->id_ == ANY) {
                iVar8 = iVar8 + 1;
              }
              else {
                pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                                   (&pvVar4->parameter_types,__n_01);
                rhs_00 = vector<duckdb::LogicalType,_true>::operator[]
                                   (function_parameter_types,__n_01);
                bVar3 = LogicalType::operator==(pvVar5,rhs_00);
                if (!bVar3) {
                  local_48.id_ = ~INVALID;
                  local_48.physical_type_ = INVALID;
                  local_48._2_6_ = 0xffffffffffff;
                  goto LAB_00a4bc5f;
                }
              }
              __n_01 = __n_01 + 1;
            } while (__n_01 < (ulong)(((long)(pvVar4->parameter_types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar4->parameter_types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          optional_idx::optional_idx((optional_idx *)&local_48,iVar8);
        }
        else {
          local_48.id_ = ~INVALID;
          local_48.physical_type_ = INVALID;
          local_48._2_6_ = 0xffffffffffff;
        }
LAB_00a4bc5f:
        local_58.index._0_1_ = local_48.id_;
        local_58.index._1_1_ = local_48.physical_type_;
        local_58.index._2_6_ = local_48._2_6_;
        if (local_48._0_8_ != 0xffffffffffffffff) {
          if (local_50.index != 0xffffffffffffffff) {
            iVar8 = optional_idx::GetIndex(&local_58);
            iVar6 = optional_idx::GetIndex(&local_50);
            if (iVar6 <= iVar8) goto LAB_00a4bcb4;
          }
          local_50.index = local_58.index;
          optional_idx::optional_idx((optional_idx *)&local_48,__n);
          local_70._0_1_ = local_48.id_;
          local_70._1_1_ = local_48.physical_type_;
          local_70._2_6_ = local_48._2_6_;
        }
LAB_00a4bcb4:
        __n = __n + 1;
      } while (__n < (ulong)((long)(function_descriptions->
                                   super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ).
                                   super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(function_descriptions->
                                   super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ).
                                   super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
    }
  }
  return (optional_idx)local_70;
}

Assistant:

static optional_idx GetFunctionDescriptionIndex(vector<FunctionDescription> &function_descriptions,
                                                vector<LogicalType> &function_parameter_types) {
	if (function_descriptions.size() == 1) {
		// one description, use it even if nr of parameters don't match
		idx_t nr_function_parameters = function_parameter_types.size();
		for (idx_t i = 0; i < function_descriptions[0].parameter_types.size(); i++) {
			if (i < nr_function_parameters && function_descriptions[0].parameter_types[i] != LogicalTypeId::ANY &&
			    function_descriptions[0].parameter_types[i] != function_parameter_types[i]) {
				return optional_idx::Invalid();
			}
		}
		return optional_idx(0);
	}

	// multiple descriptions, search most specific description
	optional_idx best_description_idx;
	// specificity_score: 0: exact type match; N: match using N <ANY> values; Invalid(): no match
	optional_idx best_specificity_score;
	optional_idx specificity_score;
	for (idx_t descr_idx = 0; descr_idx < function_descriptions.size(); descr_idx++) {
		specificity_score = CalcDescriptionSpecificity(function_descriptions[descr_idx], function_parameter_types);
		if (specificity_score.IsValid() &&
		    (!best_specificity_score.IsValid() || specificity_score.GetIndex() < best_specificity_score.GetIndex())) {
			best_specificity_score = specificity_score;
			best_description_idx = descr_idx;
		}
	}
	return best_description_idx;
}